

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void poly_BinarySink_write(BinarySink *bs,void *blkv,size_t len)

{
  ptrlen key;
  uchar *local_30;
  uchar *blk;
  ccp_context *ctx;
  size_t len_local;
  void *blkv_local;
  BinarySink *bs_local;
  
  local_30 = (uchar *)blkv;
  for (ctx = (ccp_context *)len; *(int *)&bs[-5].binarysink_ < 4 && ctx != (ccp_context *)0x0;
      ctx = (ccp_context *)((long)&ctx[-1].mac_if.binarysink_ + 7)) {
    *(uchar *)((long)bs + (long)(7 - *(int *)&bs[-5].binarysink_) + -100) = *local_30;
    *(int *)&bs[-5].binarysink_ = *(int *)&bs[-5].binarysink_ + 1;
    local_30 = local_30 + 1;
  }
  if (*(int *)&bs[-5].binarysink_ == 4) {
    chacha20_iv((chacha20 *)((long)&bs[-10].write + 4),(uchar *)((long)&bs[-5].binarysink_ + 4));
    *(int *)&bs[-5].binarysink_ = *(int *)&bs[-5].binarysink_ + 1;
    chacha20_round((chacha20 *)((long)&bs[-10].write + 4));
    key = make_ptrlen((void *)((long)&bs[-8].binarysink_ + 4),0x20);
    poly1305_key((poly1305 *)&bs[-4].writefmtv,key);
    *(undefined4 *)((long)&bs[-5].writefmtv + 4) = 0x40;
  }
  if (ctx != (ccp_context *)0x0) {
    poly1305_feed((poly1305 *)&bs[-4].writefmtv,local_30,(int)ctx);
  }
  return;
}

Assistant:

static void poly_BinarySink_write(BinarySink *bs, const void *blkv, size_t len)
{
    struct ccp_context *ctx = BinarySink_DOWNCAST(bs, struct ccp_context);
    const unsigned char *blk = (const unsigned char *)blkv;

    /* First 4 bytes are the IV */
    while (ctx->mac_initialised < 4 && len) {
        ctx->mac_iv[7 - ctx->mac_initialised] = *blk++;
        ++ctx->mac_initialised;
        --len;
    }

    /* Initialise the IV if needed */
    if (ctx->mac_initialised == 4) {
        chacha20_iv(&ctx->b_cipher, ctx->mac_iv);
        ++ctx->mac_initialised;  /* Don't do it again */

        /* Do first rotation */
        chacha20_round(&ctx->b_cipher);

        /* Set the poly key */
        poly1305_key(&ctx->mac, make_ptrlen(ctx->b_cipher.current, 32));

        /* Set the first round as used */
        ctx->b_cipher.currentIndex = 64;
    }

    /* Update the MAC with anything left */
    if (len) {
        poly1305_feed(&ctx->mac, blk, len);
    }
}